

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objtracker.cpp
# Opt level: O2

void __thiscall CObjectTracker::writeReport(CObjectTracker *this,ostream *os)

{
  allocator local_31;
  string local_30;
  
  std::endl<char,std::char_traits<char>>(os);
  std::__cxx11::string::string((string *)&local_30,"cl_device_id",&local_31);
  ReportHelper(&local_30,&this->m_Devices,os);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string((string *)&local_30,"cl_context",&local_31);
  ReportHelper(&local_30,&this->m_Contexts,os);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string((string *)&local_30,"cl_command_queue",&local_31);
  ReportHelper(&local_30,&this->m_CommandQueues,os);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string((string *)&local_30,"cl_mem",&local_31);
  ReportHelper(&local_30,&this->m_MemObjects,os);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string((string *)&local_30,"cl_sampler",&local_31);
  ReportHelper(&local_30,&this->m_Samplers,os);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string((string *)&local_30,"cl_program",&local_31);
  ReportHelper(&local_30,&this->m_Programs,os);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string((string *)&local_30,"cl_kernel",&local_31);
  ReportHelper(&local_30,&this->m_Kernels,os);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string((string *)&local_30,"cl_event",&local_31);
  ReportHelper(&local_30,&this->m_Events,os);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string((string *)&local_30,"cl_semaphore_khr",&local_31);
  ReportHelper(&local_30,&this->m_Semaphores,os);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string((string *)&local_30,"cl_command_buffer_khr",&local_31);
  ReportHelper(&local_30,&this->m_CommandBuffers,os);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string((string *)&local_30,"SVM/USM allocation",&local_31);
  ReportHelper(&local_30,&this->m_Pointers,os);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void CObjectTracker::writeReport( std::ostream& os )
{
    os << std::endl;
    ReportHelper( "cl_device_id",       m_Devices,          os );
    ReportHelper( "cl_context",         m_Contexts,         os );
    ReportHelper( "cl_command_queue",   m_CommandQueues,    os );
    ReportHelper( "cl_mem",             m_MemObjects,       os );
    ReportHelper( "cl_sampler",         m_Samplers,         os );
    ReportHelper( "cl_program",         m_Programs,         os );
    ReportHelper( "cl_kernel",          m_Kernels,          os );
    ReportHelper( "cl_event",           m_Events,           os );
    ReportHelper( "cl_semaphore_khr",   m_Semaphores,       os );
    ReportHelper( "cl_command_buffer_khr", m_CommandBuffers, os );
    ReportHelper( "SVM/USM allocation", m_Pointers,         os );
}